

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O2

int lj_ffh_bit_lshift(lua_State *L)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  CTypeID id2;
  CTypeID id;
  
  id = 0;
  id2 = 0;
  uVar1 = lj_carith_check64(L,1,&id);
  iVar3 = 2;
  uVar2 = lj_carith_check64(L,2,&id2);
  if (id == 0) {
    if (id2 != 0) {
      L->base[1].n = (double)(int)uVar2;
    }
    iVar3 = 0;
  }
  else {
    uVar1 = lj_carith_shift64(uVar1,(int)uVar2,
                              *(byte *)((L->base[-2].u64 & 0x7fffffffffff) + 10) - 0x45);
    bit_result64(L,id,uVar1);
  }
  return iVar3;
}

Assistant:

LJLIB_ASM(bit_lshift)		LJLIB_REC(bit_shift IR_BSHL)
{
#if LJ_HASFFI
  CTypeID id = 0, id2 = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  int32_t sh = (int32_t)lj_carith_check64(L, 2, &id2);
  if (id) {
    x = lj_carith_shift64(x, sh, curr_func(L)->c.ffid - (int)FF_bit_lshift);
    return bit_result64(L, id, x);
  }
  if (id2) setintV(L->base+1, sh);
  return FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  bit_checkbit(L, 2);
  return FFH_RETRY;
#endif
}